

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::MapBind(duckdb *this,ClientContext *param_1,ScalarFunction *bound_function,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *arguments)

{
  Expression EVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer puVar4;
  reference pvVar5;
  pointer pEVar6;
  LogicalType *pLVar7;
  undefined8 *puVar8;
  pointer puVar9;
  LogicalType value_type;
  LogicalType key_type;
  LogicalType local_c8;
  undefined1 local_c7;
  undefined8 local_c0;
  undefined8 uStack_b8;
  LogicalType local_b0 [24];
  LogicalType local_98 [24];
  LogicalType local_80 [24];
  LogicalType local_68 [24];
  LogicalType local_50 [24];
  LogicalType local_38 [24];
  
  puVar4 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (arguments->
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)puVar9 - (long)puVar4 != 0x10 && puVar9 != puVar4) {
    duckdb::MapVector::EvalMapInvalidReason(INVALID_PARAMS);
    puVar4 = (arguments->
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar9 = (arguments->
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (puVar4 != puVar9) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    EVar1 = pEVar6[0x38];
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    if ((EVar1 != (Expression)0x1) && (pEVar6[0x38] != (Expression)0x1)) {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      if (pEVar6[0x38] != (Expression)0x65) {
        duckdb::MapVector::EvalMapInvalidReason(INVALID_PARAMS);
      }
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,1);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      if (pEVar6[0x38] != (Expression)0x65) {
        duckdb::MapVector::EvalMapInvalidReason(INVALID_PARAMS);
      }
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      pLVar7 = (LogicalType *)duckdb::ListType::GetChildType((LogicalType *)(pEVar6 + 0x38));
      duckdb::LogicalType::LogicalType(local_68,pLVar7);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,1);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      pLVar7 = (LogicalType *)duckdb::ListType::GetChildType((LogicalType *)(pEVar6 + 0x38));
      duckdb::LogicalType::LogicalType(local_80,pLVar7);
      duckdb::LogicalType::LogicalType(local_98,local_68);
      duckdb::LogicalType::LogicalType(local_b0,local_80);
      duckdb::LogicalType::MAP(&local_c8,local_98,local_b0);
      bound_function->field_0x90 = local_c8;
      bound_function->field_0x91 = local_c7;
      uVar2 = *(undefined8 *)&bound_function->field_0x98;
      uVar3 = *(undefined8 *)&bound_function->field_0xa0;
      *(undefined8 *)&bound_function->field_0x98 = local_c0;
      *(undefined8 *)&bound_function->field_0xa0 = uStack_b8;
      local_c0 = uVar2;
      uStack_b8 = uVar3;
      duckdb::LogicalType::~LogicalType(&local_c8);
      duckdb::LogicalType::~LogicalType(local_b0);
      duckdb::LogicalType::~LogicalType(local_98);
      puVar8 = (undefined8 *)operator_new(0x20);
      duckdb::LogicalType::LogicalType(&local_c8,(LogicalType *)&bound_function->field_0x90);
      *puVar8 = &PTR__VariableReturnBindData_00891490;
      duckdb::LogicalType::LogicalType((LogicalType *)(puVar8 + 1),&local_c8);
      duckdb::LogicalType::~LogicalType(&local_c8);
      *(undefined8 **)this = puVar8;
      duckdb::LogicalType::~LogicalType(local_80);
      duckdb::LogicalType::~LogicalType(local_68);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
  }
  duckdb::LogicalType::LogicalType(local_38,SQLNULL);
  duckdb::LogicalType::LogicalType(local_50,SQLNULL);
  duckdb::LogicalType::MAP(&local_c8,local_38,local_50);
  bound_function->field_0x90 = local_c8;
  bound_function->field_0x91 = local_c7;
  uVar2 = *(undefined8 *)&bound_function->field_0x98;
  uVar3 = *(undefined8 *)&bound_function->field_0xa0;
  *(undefined8 *)&bound_function->field_0x98 = local_c0;
  *(undefined8 *)&bound_function->field_0xa0 = uStack_b8;
  local_c0 = uVar2;
  uStack_b8 = uVar3;
  duckdb::LogicalType::~LogicalType(&local_c8);
  duckdb::LogicalType::~LogicalType(local_50);
  duckdb::LogicalType::~LogicalType(local_38);
  puVar8 = (undefined8 *)operator_new(0x20);
  duckdb::LogicalType::LogicalType(&local_c8,(LogicalType *)&bound_function->field_0x90);
  *puVar8 = &PTR__VariableReturnBindData_00891490;
  duckdb::LogicalType::LogicalType((LogicalType *)(puVar8 + 1),&local_c8);
  duckdb::LogicalType::~LogicalType(&local_c8);
  *(undefined8 **)this = puVar8;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> MapBind(ClientContext &, ScalarFunction &bound_function,
                                        vector<unique_ptr<Expression>> &arguments) {

	if (arguments.size() != 2 && !arguments.empty()) {
		MapVector::EvalMapInvalidReason(MapInvalidReason::INVALID_PARAMS);
	}

	bool is_null = false;
	if (arguments.empty()) {
		is_null = true;
	}
	if (!is_null) {
		auto key_id = arguments[0]->return_type.id();
		auto value_id = arguments[1]->return_type.id();
		if (key_id == LogicalTypeId::SQLNULL || value_id == LogicalTypeId::SQLNULL) {
			is_null = true;
		}
	}

	if (is_null) {
		bound_function.return_type = LogicalType::MAP(LogicalTypeId::SQLNULL, LogicalTypeId::SQLNULL);
		return make_uniq<VariableReturnBindData>(bound_function.return_type);
	}

	// bind a MAP with key-value pairs
	D_ASSERT(arguments.size() == 2);
	if (arguments[0]->return_type.id() != LogicalTypeId::LIST) {
		MapVector::EvalMapInvalidReason(MapInvalidReason::INVALID_PARAMS);
	}
	if (arguments[1]->return_type.id() != LogicalTypeId::LIST) {
		MapVector::EvalMapInvalidReason(MapInvalidReason::INVALID_PARAMS);
	}

	auto key_type = ListType::GetChildType(arguments[0]->return_type);
	auto value_type = ListType::GetChildType(arguments[1]->return_type);

	bound_function.return_type = LogicalType::MAP(key_type, value_type);
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}